

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopThreadRazorAHRSx(RAZORAHRS *pRazorAHRS)

{
  int local_1c;
  int id;
  RAZORAHRS *pRazorAHRS_local;
  
  local_1c = 0;
  do {
    if ((RAZORAHRS *)addrsRazorAHRS[local_1c] == pRazorAHRS) {
      bExitRazorAHRS[local_1c] = 1;
      WaitForThread(RazorAHRSThreadId[local_1c]);
      DeleteCriticalSection(RazorAHRSCS + local_1c);
      resRazorAHRS[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadRazorAHRSx(RAZORAHRS* pRazorAHRS)
{
	int id = 0;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitRazorAHRS[id] = TRUE;
	WaitForThread(RazorAHRSThreadId[id]);
	DeleteCriticalSection(&RazorAHRSCS[id]);
	resRazorAHRS[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}